

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

void __thiscall FCompressedFile::FCompressedFile(FCompressedFile *this)

{
  (this->super_FFile)._vptr_FFile = (_func_int **)&PTR__FCompressedFile_00847f68;
  this->m_Pos = 0;
  this->m_BufferSize = 0;
  this->m_MaxBufferSize = 0;
  this->m_Buffer = (uchar *)0x0;
  this->m_File = (FILE *)0x0;
  this->m_NoCompress = false;
  this->m_Mode = ENotOpen;
  return;
}

Assistant:

FCompressedFile::FCompressedFile ()
{
	BeEmpty ();
}